

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTD_opt_getNextMatchAndUpdateSeqStore
               (ZSTD_optLdm_t *optLdm,U32 currPosInBlock,U32 blockBytesRemaining)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  rawSeq *prVar4;
  uint in_EDX;
  int in_ESI;
  rawSeqStore_t *in_RDI;
  U32 matchBytesRemaining;
  U32 literalsBytesRemaining;
  U32 currBlockEndPos;
  rawSeq currSeq;
  U32 local_30;
  uint local_2c;
  undefined4 local_1c;
  uint uStack_18;
  
  if ((in_RDI->size == 0) || (in_RDI->size <= in_RDI->pos)) {
    *(undefined4 *)&in_RDI[1].seq = 0xffffffff;
    *(undefined4 *)((long)&in_RDI[1].seq + 4) = 0xffffffff;
  }
  else {
    prVar4 = in_RDI->seq + in_RDI->pos;
    uVar1 = prVar4->offset;
    uVar2 = prVar4->litLength;
    local_30 = prVar4->matchLength;
    if ((ulong)(uVar2 + local_30) < in_RDI->posInSequence) {
      __assert_fail("optLdm->seqStore.posInSequence <= currSeq.litLength + currSeq.matchLength",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x82d5,"void ZSTD_opt_getNextMatchAndUpdateSeqStore(ZSTD_optLdm_t *, U32, U32)"
                   );
    }
    uVar3 = in_ESI + in_EDX;
    if (in_RDI->posInSequence < (ulong)(uint)uVar2) {
      local_2c = uVar2 - (int)in_RDI->posInSequence;
    }
    else {
      local_2c = 0;
    }
    if (local_2c == 0) {
      local_30 = local_30 - ((int)in_RDI->posInSequence - uVar2);
    }
    if (local_2c < in_EDX) {
      *(uint *)&in_RDI[1].seq = in_ESI + local_2c;
      *(U32 *)((long)&in_RDI[1].seq + 4) = *(int *)&in_RDI[1].seq + local_30;
      *(undefined4 *)&in_RDI[1].pos = uVar1;
      if (uVar3 < *(uint *)((long)&in_RDI[1].seq + 4)) {
        *(uint *)((long)&in_RDI[1].seq + 4) = uVar3;
        ZSTD_optLdm_skipRawSeqStoreBytes(in_RDI,(ulong)(uVar3 - in_ESI));
      }
      else {
        ZSTD_optLdm_skipRawSeqStoreBytes(in_RDI,(ulong)(local_2c + local_30));
      }
    }
    else {
      *(undefined4 *)&in_RDI[1].seq = 0xffffffff;
      *(undefined4 *)((long)&in_RDI[1].seq + 4) = 0xffffffff;
      ZSTD_optLdm_skipRawSeqStoreBytes(in_RDI,(ulong)in_EDX);
    }
  }
  return;
}

Assistant:

static void
ZSTD_opt_getNextMatchAndUpdateSeqStore(ZSTD_optLdm_t* optLdm, U32 currPosInBlock,
                                       U32 blockBytesRemaining)
{
    rawSeq currSeq;
    U32 currBlockEndPos;
    U32 literalsBytesRemaining;
    U32 matchBytesRemaining;

    /* Setting match end position to MAX to ensure we never use an LDM during this block */
    if (optLdm->seqStore.size == 0 || optLdm->seqStore.pos >= optLdm->seqStore.size) {
        optLdm->startPosInBlock = UINT_MAX;
        optLdm->endPosInBlock = UINT_MAX;
        return;
    }
    /* Calculate appropriate bytes left in matchLength and litLength
     * after adjusting based on ldmSeqStore->posInSequence */
    currSeq = optLdm->seqStore.seq[optLdm->seqStore.pos];
    assert(optLdm->seqStore.posInSequence <= currSeq.litLength + currSeq.matchLength);
    currBlockEndPos = currPosInBlock + blockBytesRemaining;
    literalsBytesRemaining = (optLdm->seqStore.posInSequence < currSeq.litLength) ?
            currSeq.litLength - (U32)optLdm->seqStore.posInSequence :
            0;
    matchBytesRemaining = (literalsBytesRemaining == 0) ?
            currSeq.matchLength - ((U32)optLdm->seqStore.posInSequence - currSeq.litLength) :
            currSeq.matchLength;

    /* If there are more literal bytes than bytes remaining in block, no ldm is possible */
    if (literalsBytesRemaining >= blockBytesRemaining) {
        optLdm->startPosInBlock = UINT_MAX;
        optLdm->endPosInBlock = UINT_MAX;
        ZSTD_optLdm_skipRawSeqStoreBytes(&optLdm->seqStore, blockBytesRemaining);
        return;
    }

    /* Matches may be < MINMATCH by this process. In that case, we will reject them
       when we are deciding whether or not to add the ldm */
    optLdm->startPosInBlock = currPosInBlock + literalsBytesRemaining;
    optLdm->endPosInBlock = optLdm->startPosInBlock + matchBytesRemaining;
    optLdm->offset = currSeq.offset;

    if (optLdm->endPosInBlock > currBlockEndPos) {
        /* Match ends after the block ends, we can't use the whole match */
        optLdm->endPosInBlock = currBlockEndPos;
        ZSTD_optLdm_skipRawSeqStoreBytes(&optLdm->seqStore, currBlockEndPos - currPosInBlock);
    } else {
        /* Consume nb of bytes equal to size of sequence left */
        ZSTD_optLdm_skipRawSeqStoreBytes(&optLdm->seqStore, literalsBytesRemaining + matchBytesRemaining);
    }
}